

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

int __thiscall CTPNCodeBodyBase::get_or_add_ctx_var_for_level(CTPNCodeBodyBase *this,int level)

{
  int iVar1;
  CTcParser *pCVar2;
  CTcCodeBodyCtx *pCVar3;
  CTcCodeBodyCtx **ppCVar4;
  
  for (pCVar3 = this->ctx_head_; pCVar3 != (CTcCodeBodyCtx *)0x0; pCVar3 = pCVar3->nxt_) {
    if (pCVar3->level_ == level) goto LAB_00202822;
  }
  pCVar3 = (CTcCodeBodyCtx *)CTcPrsMem::alloc(G_prsmem,0x18);
  pCVar3->level_ = level;
  pCVar2 = G_prs;
  iVar1 = G_prs->local_cnt_;
  if (G_prs->max_local_cnt_ <= iVar1) {
    G_prs->max_local_cnt_ = iVar1 + 1;
  }
  pCVar2->local_cnt_ = iVar1 + 1;
  pCVar3->var_num_ = iVar1;
  this->local_cnt_ = G_prs->max_local_cnt_;
  pCVar3->prv_ = this->ctx_tail_;
  pCVar3->nxt_ = (CTcCodeBodyCtx *)0x0;
  ppCVar4 = &this->ctx_tail_->nxt_;
  if (this->ctx_tail_ == (CTcCodeBodyCtx *)0x0) {
    ppCVar4 = &this->ctx_head_;
  }
  *ppCVar4 = pCVar3;
  this->ctx_tail_ = pCVar3;
LAB_00202822:
  return pCVar3->var_num_;
}

Assistant:

int CTPNCodeBodyBase::get_or_add_ctx_var_for_level(int level)
{
    /* scan our list to see if the level is already assigned */
    CTcCodeBodyCtx *ctx;
    for (ctx = ctx_head_ ; ctx != 0 ; ctx = ctx->nxt_)
    {
        /* if we've already set up this level, return its variable */
        if (ctx->level_ == level)
            return ctx->var_num_;
    }

    /* we didn't find it - allocate a new level structure */
    ctx = new (G_prsmem) CTcCodeBodyCtx();
    
    /* set up its level and allocate a new variable and property for it */
    ctx->level_ = level;
    ctx->var_num_ = G_prs->alloc_ctx_holder_var();

    /* 
     *   allocating a new variable probably increased the maximum local
     *   variable count - update our information from the parser 
     */
    local_cnt_ = G_prs->get_max_local_cnt();

    /* link it into our list */
    ctx->prv_ = ctx_tail_;
    ctx->nxt_ = 0;
    if (ctx_tail_ != 0)
        ctx_tail_->nxt_ = ctx;
    else
        ctx_head_ = ctx;
    ctx_tail_ = ctx;

    /* return the variable for the new level */
    return ctx->var_num_;
}